

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

double rcg::getFloat(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,double *vmin,
                    double *vmax,bool exception,bool igncache)

{
  element_type *peVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  invalid_argument *piVar5;
  allocator local_b1;
  double local_b0;
  double local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [2];
  
  if (vmin != (double *)0x0) {
    *vmin = 0.0;
  }
  if (vmax != (double *)0x0) {
    *vmax = 0.0;
  }
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_80,name);
  iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_80);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_80);
  if (plVar4 == (long *)0x0) {
    local_b0 = 0.0;
    if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not found: ",&local_b1);
      std::operator+(local_80,&local_a0,name);
      std::invalid_argument::invalid_argument(piVar5,(string *)local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar3 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if (iVar3 - 3U < 2) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
      if (plVar4 == (long *)0x0) {
        local_b0 = 0.0;
        if (exception) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_a0,"Feature not float: ",&local_b1);
          std::operator+(local_80,&local_a0,name);
          std::invalid_argument::invalid_argument(piVar5,(string *)local_80);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_a8 = 0.0;
        local_b0 = (double)(**(code **)(*plVar4 + 0x48))(plVar4,0,igncache);
        if (vmin != (double *)0x0) {
          local_a8 = local_b0;
          dVar2 = (double)(**(code **)(*plVar4 + 0x60))(plVar4);
          *vmin = dVar2;
        }
        if (vmax != (double *)0x0) {
          local_a8 = local_b0;
          dVar2 = (double)(**(code **)(*plVar4 + 0x68))(plVar4);
          *vmax = dVar2;
        }
      }
    }
    else {
      local_b0 = 0.0;
      if (exception) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_a0,"Feature not readable: ",&local_b1);
        std::operator+(local_80,&local_a0,name);
        std::invalid_argument::invalid_argument(piVar5,(string *)local_80);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  return local_b0;
}

Assistant:

double getFloat(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                double *vmin, double *vmax, bool exception, bool igncache)
{
  double ret=0;

  if (vmin != 0) *vmin=0;
  if (vmax != 0) *vmax=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IFloat *val=dynamic_cast<GenApi::IFloat *>(node);

        if (val != 0)
        {
          ret=val->GetValue(false, igncache);

          if (vmin != 0) *vmin=val->GetMin();
          if (vmax != 0) *vmax=val->GetMax();
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not float: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}